

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_if_t::Generate(ast_if_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  int else_loc;
  int true_loc;
  int pc_local;
  ostream *output_local;
  ast_if_t *this_local;
  
  iVar1 = (*this->condition->_vptr_ast_item_t[2])(this->condition,output,(ulong)(uint)pc);
  poVar2 = std::operator<<(output,"jz __label_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"__");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  else_loc = ast_t::Generate(this->true_path,output,iVar1 + 1);
  if (this->else_path == (ast_t *)0x0) {
    poVar2 = std::operator<<(output,": __label_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"__");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<(output,"jmp __label_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,else_loc);
    poVar2 = std::operator<<(poVar2,"__");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(output,": __label_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"__");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar1 = ast_t::Generate(this->else_path,output,else_loc + 1);
    poVar2 = std::operator<<(output,": __label_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,else_loc);
    poVar2 = std::operator<<(poVar2,"__");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    else_loc = iVar1;
  }
  return else_loc;
}

Assistant:

int ast_if_t::Generate(std::ostream& output, int pc) const {
    pc = this->condition->Generate(output, pc);

    int true_loc = pc;

    output << "jz __label_" << true_loc << "__" << std::endl;
    pc = this->true_path->Generate(output, pc + 1);

    if (this->else_path != nullptr)
    {
      int else_loc = pc;
      output << "jmp __label_" << else_loc << "__" << std::endl;
      output << ": __label_" << true_loc << "__" << std::endl;
      pc = this->else_path->Generate(output, pc + 1);
      output << ": __label_" << else_loc << "__" << std::endl;
    }
    else
    {
      output << ": __label_" << true_loc << "__" << std::endl;
    }
    return pc;
  }